

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table_visitor.cpp
# Opt level: O0

void __thiscall symbol_table_visitor::visit(symbol_table_visitor *this,Assignment *ptr)

{
  string *this_00;
  allocator<char> local_19;
  Assignment *local_18;
  Assignment *ptr_local;
  symbol_table_visitor *this_local;
  
  local_18 = ptr;
  ptr_local = (Assignment *)this;
  (**(ptr->lvalue->super_Base)._vptr_Base)();
  (**(local_18->rvalue->super_Base)._vptr_Base)(local_18->rvalue,this);
  if ((local_18->lvalue->is_lvalue & 1U) == 0) {
    this_00 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,"syntax error: not lvalue in left part of assignment",&local_19);
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  assert_type(this,local_18->rvalue->type,local_18->lvalue->type);
  return;
}

Assistant:

void symbol_table_visitor::visit(Assignment* ptr) {
    ptr->lvalue->accept(this);
    ptr->rvalue->accept(this);
    if (!ptr->lvalue->is_lvalue) {
        throw std::string("syntax error: not lvalue in left part of assignment");
    }
    assert_type(ptr->rvalue->type, ptr->lvalue->type);
}